

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinDFA.cpp
# Opt level: O2

void __thiscall
la::LevenshteinDFA::Search
          (LevenshteinDFA *this,trie_tree *trie,int start,trie_node *node,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  map<std::pair<int,_char>,_int,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
  *this_00;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_01;
  trie_node *ptVar1;
  _List_iterator<int> _Var2;
  iterator iVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  bool bVar7;
  _List_node_base *p_Var8;
  int i;
  long lVar9;
  int i_1;
  pair<int,_char> pair;
  list<char,_std::allocator<char>_> inputs;
  int local_7c;
  LevenshteinDFA *local_78;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_70;
  key_type local_68;
  trie_tree *local_60;
  _Base_ptr local_58;
  _List_node_base *local_50;
  _List_base<char,_std::allocator<char>_> local_48;
  
  local_7c = start;
  local_78 = this;
  local_70 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)output;
  local_60 = trie;
  _Var2 = std::__find_if<std::_List_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((this->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl.
                     _M_node.super__List_node_base._M_next,&this->_finalStates,&local_7c);
  if ((_Var2._M_node != (_List_node_base *)&this->_finalStates) && (node->_is_end_word == true)) {
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>(local_70,&node->_value);
  }
  local_48._M_impl._M_node._M_size = 0;
  p_Var8 = (_List_node_base *)&local_78->_uniqueChars;
  this_00 = &local_78->_transTable;
  local_58 = &(local_78->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_50 = p_Var8;
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_48;
  while (p_Var8 = (((_List_base<char,_std::allocator<char>_> *)&p_Var8->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next, p_Var8 != local_50) {
    local_68.second = *(char *)&p_Var8[1]._M_next;
    local_68.first = local_7c;
    iVar3 = std::
            _Rb_tree<std::pair<int,_char>,_std::pair<const_std::pair<int,_char>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_char>,_int>_>,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
            ::find(&this_00->_M_t,&local_68);
    if (iVar3._M_node != local_58) {
      std::__cxx11::list<char,std::allocator<char>>::emplace_back<char&>
                ((list<char,std::allocator<char>> *)&local_48,(char *)(p_Var8 + 1));
      for (lVar9 = 0; lVar9 != 0x28; lVar9 = lVar9 + 1) {
        ptVar1 = (node->_children)._M_elems[lVar9];
        if ((ptVar1 != (trie_node *)0x0) && (ptVar1->_key == *(char *)&p_Var8[1]._M_next)) {
          pmVar4 = std::
                   map<std::pair<int,_char>,_int,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
                   ::at(this_00,&local_68);
          Search(local_78,local_60,*pmVar4,(node->_children)._M_elems[lVar9],
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70);
        }
      }
    }
  }
  this_01 = &local_78->_defaultTrans;
  iVar5 = std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_01->_M_h,&local_7c);
  if (iVar5.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur != (__node_type *)0x0
     ) {
    for (lVar9 = 0; lVar9 != 0x28; lVar9 = lVar9 + 1) {
      ptVar1 = (node->_children)._M_elems[lVar9];
      if (ptVar1 != (trie_node *)0x0) {
        bVar7 = false;
        p_Var8 = (_List_node_base *)&local_48;
        while( true ) {
          p_Var8 = p_Var8->_M_next;
          if (p_Var8 == (_List_node_base *)&local_48) break;
          bVar7 = (bool)(bVar7 | *(char *)&p_Var8[1]._M_next == ptVar1->_key);
        }
        if (!bVar7) {
          pmVar6 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,&local_7c);
          Search(local_78,local_60,*pmVar6,(node->_children)._M_elems[lVar9],
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70);
        }
      }
    }
  }
  std::__cxx11::_List_base<char,_std::allocator<char>_>::_M_clear(&local_48);
  return;
}

Assistant:

void LevenshteinDFA::Search(const trie_tree &trie, int start, trie_node * node, std::list<std::string> &output)
    {
        /**/
        if (std::find(_finalStates.begin(), _finalStates.end(), start) != _finalStates.end() &&node->_is_end_word )
        {
            output.emplace_back(node->_value);
        }
        std::list<char> inputs;
        for (std::list<char>::iterator it = _uniqueChars.begin(); it != _uniqueChars.end();++it)
        {
            std::pair<int, char> pair = std::make_pair(start, *it);
            auto it2 = _transTable.find(pair);
            if (it2 != _transTable.end())
            {
                inputs.emplace_back(*it);
                for (int i = 0; i < trie_node::ALPHABET_SIZE; ++i)
                {
                    if (node->_children[i] == NULL)
                        continue;
                    if (node->_children[i]->_key == *it)
                    {
                        Search(trie, _transTable.at(pair), node->_children[i], output);
                    }
                }
            }
        }
        auto it = _defaultTrans.find(start);
        if (it != _defaultTrans.end())
        {
            for (int i = 0; i < trie_node::ALPHABET_SIZE; ++i)
            {
                bool found = false;;
                if (node->_children[i] == NULL) continue;
                for (std::list<char>::iterator it = inputs.begin(); it != inputs.end();++it)
                {
                    if (*it == node->_children[i]->_key)
                    {
                        found = true;
                    }
                }
                if (!found)
                {
                    Search(trie, _defaultTrans.at(start), node->_children[i], output);
                }
            }
        }

    }